

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CncFileDescriptor.h
# Opt level: O0

AtomicBuffer * aeron::CncFileDescriptor::createToDriverBuffer(ptr_t *cncFile)

{
  index_t iVar1;
  element_type *peVar2;
  uint8_t *puVar3;
  MetaDataDefn *pMVar4;
  AtomicBuffer *in_RDI;
  MetaDataDefn *metaData;
  AtomicBuffer metaDataBuffer;
  size_t in_stack_ffffffffffffff88;
  index_t offset;
  AtomicBuffer *this;
  AtomicBuffer local_28;
  
  this = in_RDI;
  peVar2 = std::
           __shared_ptr_access<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1e1aed);
  puVar3 = util::MemoryMappedFile::getMemoryPtr(peVar2);
  peVar2 = std::
           __shared_ptr_access<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1e1b04);
  util::MemoryMappedFile::getMemorySize(peVar2);
  iVar1 = util::convertSizeToIndex(in_stack_ffffffffffffff88);
  offset = (index_t)(in_stack_ffffffffffffff88 >> 0x20);
  concurrent::AtomicBuffer::AtomicBuffer(&local_28,puVar3,(long)iVar1);
  pMVar4 = concurrent::AtomicBuffer::overlayStruct<aeron::CncFileDescriptor::MetaDataDefn>
                     (this,offset);
  peVar2 = std::
           __shared_ptr_access<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1e1b52);
  puVar3 = util::MemoryMappedFile::getMemoryPtr(peVar2);
  concurrent::AtomicBuffer::AtomicBuffer
            (this,puVar3 + META_DATA_LENGTH,(long)pMVar4->toDriverBufferLength);
  concurrent::AtomicBuffer::~AtomicBuffer(&local_28);
  return in_RDI;
}

Assistant:

inline static AtomicBuffer createToDriverBuffer(MemoryMappedFile::ptr_t cncFile)
{
    AtomicBuffer metaDataBuffer(cncFile->getMemoryPtr(), convertSizeToIndex(cncFile->getMemorySize()));

    const MetaDataDefn& metaData = metaDataBuffer.overlayStruct<MetaDataDefn>(0);

    return AtomicBuffer(cncFile->getMemoryPtr() + META_DATA_LENGTH, metaData.toDriverBufferLength);
}